

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int newDatabase(BtShared *pBt)

{
  u8 uVar1;
  MemPage *pPage;
  u8 *puVar2;
  int iVar3;
  
  if (pBt->nPage != 0) {
    return 0;
  }
  pPage = pBt->pPage1;
  puVar2 = pPage->aData;
  iVar3 = sqlite3PagerWrite(pPage->pDbPage);
  if (iVar3 == 0) {
    puVar2[0] = 'S';
    puVar2[1] = 'Q';
    puVar2[2] = 'L';
    puVar2[3] = 'i';
    puVar2[4] = 't';
    puVar2[5] = 'e';
    puVar2[6] = ' ';
    puVar2[7] = 'f';
    puVar2[8] = 'o';
    puVar2[9] = 'r';
    puVar2[10] = 'm';
    puVar2[0xb] = 'a';
    puVar2[0xc] = 't';
    puVar2[0xd] = ' ';
    puVar2[0xe] = '3';
    puVar2[0xf] = '\0';
    puVar2[0x10] = *(u8 *)((long)&pBt->pageSize + 1);
    puVar2[0x11] = *(u8 *)((long)&pBt->pageSize + 2);
    puVar2[0x12] = '\x01';
    puVar2[0x13] = '\x01';
    puVar2[0x14] = (char)pBt->pageSize - (char)pBt->usableSize;
    puVar2[0x15] = '@';
    puVar2[0x16] = ' ';
    puVar2[0x17] = ' ';
    puVar2[0x18] = '\0';
    puVar2[0x19] = '\0';
    puVar2[0x1a] = '\0';
    puVar2[0x1b] = '\0';
    puVar2[0x1c] = '\0';
    puVar2[0x1d] = '\0';
    puVar2[0x1e] = '\0';
    puVar2[0x1f] = '\0';
    puVar2[0x20] = '\0';
    puVar2[0x21] = '\0';
    puVar2[0x22] = '\0';
    puVar2[0x23] = '\0';
    puVar2[0x24] = '\0';
    puVar2[0x25] = '\0';
    puVar2[0x26] = '\0';
    puVar2[0x27] = '\0';
    puVar2[0x28] = '\0';
    puVar2[0x29] = '\0';
    puVar2[0x2a] = '\0';
    puVar2[0x2b] = '\0';
    puVar2[0x2c] = '\0';
    puVar2[0x2d] = '\0';
    puVar2[0x2e] = '\0';
    puVar2[0x2f] = '\0';
    puVar2[0x30] = '\0';
    puVar2[0x31] = '\0';
    puVar2[0x32] = '\0';
    puVar2[0x33] = '\0';
    puVar2[0x34] = '\0';
    puVar2[0x35] = '\0';
    puVar2[0x36] = '\0';
    puVar2[0x37] = '\0';
    puVar2[0x38] = '\0';
    puVar2[0x39] = '\0';
    puVar2[0x3a] = '\0';
    puVar2[0x3b] = '\0';
    puVar2[0x3c] = '\0';
    puVar2[0x3d] = '\0';
    puVar2[0x3e] = '\0';
    puVar2[0x3f] = '\0';
    puVar2[0x40] = '\0';
    puVar2[0x41] = '\0';
    puVar2[0x42] = '\0';
    puVar2[0x43] = '\0';
    puVar2[0x44] = '\0';
    puVar2[0x45] = '\0';
    puVar2[0x46] = '\0';
    puVar2[0x47] = '\0';
    puVar2[0x48] = '\0';
    puVar2[0x49] = '\0';
    puVar2[0x4a] = '\0';
    puVar2[0x4b] = '\0';
    puVar2[0x4c] = '\0';
    puVar2[0x4d] = '\0';
    puVar2[0x4e] = '\0';
    puVar2[0x4f] = '\0';
    puVar2[0x50] = '\0';
    puVar2[0x51] = '\0';
    puVar2[0x52] = '\0';
    puVar2[0x53] = '\0';
    puVar2[0x54] = '\0';
    puVar2[0x55] = '\0';
    puVar2[0x56] = '\0';
    puVar2[0x57] = '\0';
    puVar2[0x54] = '\0';
    puVar2[0x55] = '\0';
    puVar2[0x56] = '\0';
    puVar2[0x57] = '\0';
    puVar2[0x58] = '\0';
    puVar2[0x59] = '\0';
    puVar2[0x5a] = '\0';
    puVar2[0x5b] = '\0';
    puVar2[0x5c] = '\0';
    puVar2[0x5d] = '\0';
    puVar2[0x5e] = '\0';
    puVar2[0x5f] = '\0';
    puVar2[0x60] = '\0';
    puVar2[0x61] = '\0';
    puVar2[0x62] = '\0';
    puVar2[99] = '\0';
    zeroPage(pPage,0xd);
    *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
    uVar1 = pBt->autoVacuum;
    iVar3 = 0;
    puVar2[0x34] = '\0';
    puVar2[0x35] = '\0';
    puVar2[0x36] = '\0';
    puVar2[0x37] = uVar1;
    uVar1 = pBt->incrVacuum;
    puVar2[0x40] = '\0';
    puVar2[0x41] = '\0';
    puVar2[0x42] = '\0';
    puVar2[0x43] = uVar1;
    pBt->nPage = 1;
    puVar2[0x1f] = '\x01';
  }
  return iVar3;
}

Assistant:

static int newDatabase(BtShared *pBt){
  MemPage *pP1;
  unsigned char *data;
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pBt->nPage>0 ){
    return SQLITE_OK;
  }
  pP1 = pBt->pPage1;
  assert( pP1!=0 );
  data = pP1->aData;
  rc = sqlite3PagerWrite(pP1->pDbPage);
  if( rc ) return rc;
  memcpy(data, zMagicHeader, sizeof(zMagicHeader));
  assert( sizeof(zMagicHeader)==16 );
  data[16] = (u8)((pBt->pageSize>>8)&0xff);
  data[17] = (u8)((pBt->pageSize>>16)&0xff);
  data[18] = 1;
  data[19] = 1;
  assert( pBt->usableSize<=pBt->pageSize && pBt->usableSize+255>=pBt->pageSize);
  data[20] = (u8)(pBt->pageSize - pBt->usableSize);
  data[21] = 64;
  data[22] = 32;
  data[23] = 32;
  memset(&data[24], 0, 100-24);
  zeroPage(pP1, PTF_INTKEY|PTF_LEAF|PTF_LEAFDATA );
  pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
  assert( pBt->autoVacuum==1 || pBt->autoVacuum==0 );
  assert( pBt->incrVacuum==1 || pBt->incrVacuum==0 );
  put4byte(&data[36 + 4*4], pBt->autoVacuum);
  put4byte(&data[36 + 7*4], pBt->incrVacuum);
#endif
  pBt->nPage = 1;
  data[31] = 1;
  return SQLITE_OK;
}